

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

GLenum gl4cts::TextureViewUtilities::getTypeCompatibleWithInternalformat(GLenum internalformat)

{
  TestError *this;
  GLenum result;
  GLenum internalformat_local;
  
  if (internalformat != 0x8051) {
    if (internalformat == 0x8054) {
      return 0x1403;
    }
    if (3 < internalformat - 0x8056) {
      if (internalformat == 0x805b) {
        return 0x1403;
      }
      if (internalformat == 0x81a5) {
        return 0x1403;
      }
      if (internalformat == 0x81a6) {
        return 0x1405;
      }
      if (internalformat != 0x8229) {
        if (internalformat == 0x822a) {
          return 0x1403;
        }
        if (internalformat != 0x822b) {
          if (internalformat == 0x822c) {
            return 0x1403;
          }
          if (internalformat == 0x822d) {
            return 0x140b;
          }
          if (internalformat == 0x822e) {
            return 0x1406;
          }
          if (internalformat == 0x822f) {
            return 0x140b;
          }
          if (internalformat == 0x8230) {
            return 0x1406;
          }
          if (internalformat == 0x8231) {
            return 0x1400;
          }
          if (internalformat != 0x8232) {
            if (internalformat == 0x8233) {
              return 0x1402;
            }
            if (internalformat == 0x8234) {
              return 0x1403;
            }
            if (internalformat == 0x8235) {
              return 0x1404;
            }
            if (internalformat == 0x8236) {
              return 0x1405;
            }
            if (internalformat == 0x8237) {
              return 0x1400;
            }
            if (internalformat != 0x8238) {
              if (internalformat == 0x8239) {
                return 0x1402;
              }
              if (internalformat == 0x823a) {
                return 0x1403;
              }
              if (internalformat == 0x823b) {
                return 0x1404;
              }
              if (internalformat == 0x823c) {
                return 0x1405;
              }
              if (internalformat - 0x8814 < 2) {
                return 0x1406;
              }
              if (internalformat - 0x881a < 2) {
                return 0x140b;
              }
              if (internalformat == 0x88f0) {
                return 0x84fa;
              }
              if (internalformat == 0x8c3a) {
                return 0x1406;
              }
              if (((internalformat != 0x8c3d) && (internalformat != 0x8c41)) &&
                 (internalformat != 0x8c43)) {
                if (internalformat == 0x8cac) {
                  return 0x1406;
                }
                if (internalformat == 0x8cad) {
                  return 0x8dad;
                }
                if (internalformat != 0x8d62) {
                  if (internalformat - 0x8d70 < 2) {
                    return 0x1405;
                  }
                  if (internalformat - 0x8d76 < 2) {
                    return 0x1403;
                  }
                  if (1 < internalformat - 0x8d7c) {
                    if (internalformat - 0x8d82 < 2) {
                      return 0x1404;
                    }
                    if (internalformat - 0x8d88 < 2) {
                      return 0x1402;
                    }
                    if (internalformat - 0x8d8e < 2) {
                      return 0x1400;
                    }
                    if (3 < internalformat - 0x8f94) {
                      if (internalformat - 0x8f98 < 4) {
                        return 0x1402;
                      }
                      if (internalformat == 0x906f) {
                        return 0x8368;
                      }
                      this = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (this,"Unrecognized internalformat",(char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                                 ,0x7f5);
                      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                    }
                    return 0x1400;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0x1401;
}

Assistant:

glw::GLenum TextureViewUtilities::getTypeCompatibleWithInternalformat(const glw::GLenum internalformat)
{
	glw::GLenum result = GL_NONE;

	/* Compressed internalformats not supported at the moment */

	switch (internalformat)
	{
	case GL_RGBA8_SNORM:
	case GL_RGB8_SNORM:
	case GL_RG8_SNORM:
	case GL_R8_SNORM:
	case GL_RGBA8I:
	case GL_RGB8I:
	case GL_RG8I:
	case GL_R8I:
	{
		result = GL_BYTE;

		break;
	}

	case GL_DEPTH24_STENCIL8:
	{
		result = GL_UNSIGNED_INT_24_8;

		break;
	}

	case GL_DEPTH32F_STENCIL8:
	{
		result = GL_FLOAT_32_UNSIGNED_INT_24_8_REV;

		break;
	}

	case GL_RGBA16F:
	case GL_RGB16F:
	case GL_RG16F:
	case GL_R16F:
	{
		result = GL_HALF_FLOAT;

		break;
	}

	case GL_DEPTH_COMPONENT32F:
	case GL_RGBA32F:
	case GL_RGB32F:
	case GL_RG32F:
	case GL_R11F_G11F_B10F:
	case GL_R32F:
	{
		result = GL_FLOAT;

		break;
	}

	case GL_RGBA16_SNORM:
	case GL_RGB16_SNORM:
	case GL_RG16_SNORM:
	case GL_R16_SNORM:
	{
		result = GL_SHORT;

		break;
	}

	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGB10_A2:
	case GL_RGB5_A1:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RGB9_E5:
	case GL_RG8:
	case GL_R8:
	case GL_SRGB8_ALPHA8:
	case GL_SRGB8:
	case GL_RGBA8UI:
	case GL_RGB8UI:
	case GL_RG8UI:
	case GL_R8UI:
	{
		result = GL_UNSIGNED_BYTE;

		break;
	}

	case GL_R16I:
	case GL_RGBA16I:
	case GL_RGB16I:
	case GL_RG16I:
	{
		result = GL_SHORT;

		break;
	}

	case GL_DEPTH_COMPONENT16:
	case GL_RGBA16:
	case GL_RGB16:
	case GL_RG16:
	case GL_R16:
	case GL_RGBA16UI:
	case GL_RGB16UI:
	case GL_RG16UI:
	case GL_R16UI:
	{
		result = GL_UNSIGNED_SHORT;

		break;
	}

	case GL_RGBA32I:
	case GL_RGB32I:
	case GL_RG32I:
	case GL_R32I:
	{
		result = GL_INT;

		break;
	}

	case GL_DEPTH_COMPONENT24:
	case GL_RGBA32UI:
	case GL_RGB32UI:
	case GL_RG32UI:
	case GL_R32UI:
	{
		result = GL_UNSIGNED_INT;

		break;
	}

	case GL_RGB10_A2UI:
	{
		result = GL_UNSIGNED_INT_2_10_10_10_REV;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */

	return result;
}